

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int __thiscall AActor::ApplyDamageFactor(AActor *this,FName *damagetype,int damage)

{
  int damage_00;
  MetaClass *pMVar1;
  FName local_20;
  int local_1c;
  FName *pFStack_18;
  int damage_local;
  FName *damagetype_local;
  AActor *this_local;
  
  damage_00 = (int)((double)damage * this->DamageFactor);
  local_1c = damage_00;
  if (0 < damage_00) {
    pFStack_18 = damagetype;
    damagetype_local = (FName *)this;
    FName::FName(&local_20,damagetype);
    pMVar1 = GetClass(this);
    local_1c = DamageTypeDefinition::ApplyMobjDamageFactor
                         (damage_00,&local_20,pMVar1->DamageFactors);
  }
  return local_1c;
}

Assistant:

int AActor::ApplyDamageFactor(FName damagetype, int damage) const
{
	damage = int(damage * DamageFactor);
	if (damage > 0)
	{
		damage = DamageTypeDefinition::ApplyMobjDamageFactor(damage, damagetype, GetClass()->DamageFactors);
	}
	return damage;
}